

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall duckdb::Expression::IsAggregate(Expression *this)

{
  bool is_aggregate;
  anon_class_8_1_dcd776e8 *in_stack_ffffffffffffffb8;
  function<void_(const_duckdb::Expression_&)> *in_stack_ffffffffffffffc0;
  function<void_(const_duckdb::Expression_&)> *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar1;
  
  bVar1 = 0;
  ::std::function<void(duckdb::Expression_const&)>::
  function<duckdb::Expression::IsAggregate()const::__0,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ExpressionIterator::EnumerateChildren
            ((Expression *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  ::std::function<void_(const_duckdb::Expression_&)>::~function
            ((function<void_(const_duckdb::Expression_&)> *)0xe6fc2f);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Expression::IsAggregate() const {
	bool is_aggregate = false;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) { is_aggregate |= child.IsAggregate(); });
	return is_aggregate;
}